

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O0

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
* __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator::
next(FastInstancesIterator *this)

{
  bool bVar1;
  InstMatcher *in_RSI;
  Renaming *in_RDI;
  Renaming normalizer;
  bool ground;
  Lhs *ld;
  Renaming *in_stack_ffffffffffffff50;
  SmartPtr<Indexing::ResultSubstitution> *this_00;
  SmartPtr<Indexing::ResultSubstitution> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar2;
  Renaming *this_01;
  SmartPtr<Indexing::ResultSubstitution> local_80;
  SmartPtr<Indexing::ResultSubstitution> local_70 [3];
  FastInstancesIterator *in_stack_ffffffffffffffc8;
  
  this_01 = in_RDI;
  do {
    bVar1 = Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::hasNext
                      ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x44b01f)
    ;
    uVar2 = false;
    if (!bVar1) {
      uVar2 = findNextLeaf(in_stack_ffffffffffffffc8);
    }
  } while ((bool)uVar2 != false);
  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::next
            ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x44b054);
  if (((in_RSI->_boundVars)._capacity & 1) == 0) {
    Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr(&local_80);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
    ::QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
                *)CONCAT17(uVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58,
               (Lhs *)in_stack_ffffffffffffff50);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
              ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_ffffffffffffff50);
  }
  else {
    Kernel::Renaming::reset(in_stack_ffffffffffffff50);
    Inferences::ALASCA::BinaryResolutionConf::Lhs::key((Lhs *)0x44b08b);
    bVar1 = SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::isGround
                      ((Literal *)0x44b093);
    if (!bVar1) {
      Kernel::Renaming::Renaming(in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff58 =
           (SmartPtr<Indexing::ResultSubstitution> *)
           Inferences::ALASCA::BinaryResolutionConf::Lhs::key((Lhs *)0x44b0bd);
      Kernel::Renaming::normalizeVariables
                ((Renaming *)CONCAT17(uVar2,in_stack_ffffffffffffff60),
                 (Literal *)in_stack_ffffffffffffff58);
      Kernel::Renaming::makeInverse(this_01,in_RDI);
      Kernel::Renaming::~Renaming((Renaming *)0x44b0f4);
    }
    this_00 = local_70;
    SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::getSubstitution
              (in_RSI,this_01);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
    ::QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
                *)CONCAT17(uVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58,(Lhs *)this_00
              );
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(this_00);
  }
  return (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
          *)this_01;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastInstancesIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultDenormalizer.reset();
    bool ground = SubstitutionTree::isGround(ld->key());
    if(!ground) {
      Renaming normalizer;
      normalizer.normalizeVariables(ld->key());
      _resultDenormalizer.makeInverse(normalizer);
    }

    return QueryRes(_subst.getSubstitution(&_resultDenormalizer), ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}